

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v7::detail::
     handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>&>
               (char spec,
               int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *handler)

{
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *in_RSI;
  char in_DIL;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *unaff_retaddr;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *in_stack_00000040;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *in_stack_00000390;
  
  if (in_DIL == '\0') {
LAB_0028a367:
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_dec
              (in_stack_00000040);
    return;
  }
  if (in_DIL == 'B') {
LAB_0028a37f:
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_bin
              (in_stack_00000040);
  }
  else {
    if (in_DIL == 'L') {
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
                (in_stack_00000390);
      return;
    }
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_0028a37f;
      if (in_DIL == 'c') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_chr(in_RSI);
        return;
      }
      if (in_DIL == 'd') goto LAB_0028a367;
      if (in_DIL == 'o') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_oct
                  (in_stack_00000040);
        return;
      }
      if (in_DIL != 'x') {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_error
                  (unaff_retaddr);
      }
    }
    int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_hex
              (in_stack_00000040);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}